

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  int num_rects;
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  psStack_30 = (stbrp_rect *)0x0;
  num_rects = (atlas->CustomRects).Size;
  if (0 < num_rects) {
    iVar4 = 8;
    if (7 < num_rects) {
      iVar4 = num_rects;
    }
    if (0 < iVar4) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((long)iVar4 * 0x18);
    }
  }
  memset(psStack_30,0,(long)num_rects * 0x18);
  if (0 < (atlas->CustomRects).Size) {
    lVar1 = 0;
    lVar2 = 0;
    lVar3 = 0;
    do {
      *(uint *)((long)&psStack_30->w + lVar1) =
           (uint)*(ushort *)((long)&((atlas->CustomRects).Data)->Width + lVar2);
      *(uint *)((long)&psStack_30->h + lVar1) =
           (uint)*(ushort *)((long)&((atlas->CustomRects).Data)->Height + lVar2);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
      lVar1 = lVar1 + 0x18;
    } while (lVar3 < (atlas->CustomRects).Size);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psStack_30,num_rects);
  if (0 < num_rects) {
    lVar1 = 0;
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (*(int *)((long)&psStack_30->was_packed + lVar2) != 0) {
        *(undefined2 *)((long)&((atlas->CustomRects).Data)->X + lVar1) =
             *(undefined2 *)((long)&psStack_30->x + lVar2);
        *(undefined2 *)((long)&((atlas->CustomRects).Data)->Y + lVar1) =
             *(undefined2 *)((long)&psStack_30->y + lVar2);
        iVar4 = *(int *)((long)&psStack_30->h + lVar2) + *(int *)((long)&psStack_30->y + lVar2);
        if (iVar4 < atlas->TexHeight) {
          iVar4 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar4;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
      lVar1 = lVar1 + 0x20;
    } while (lVar3 < num_rects);
  }
  if (psStack_30 != (stbrp_rect *)0x0) {
    ImGui::MemFree(psStack_30);
  }
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}